

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

void scp::_scp::cooleyTukey<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size,pair<unsigned_long,_unsigned_long> *factors,uint64_t factorCount)

{
  unsigned_long *puVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  size_type sVar5;
  ulong uVar6;
  uint64_t i;
  long lVar7;
  uint64_t k;
  size_type __n;
  uint64_t baseStride_00;
  pair<unsigned_long,_unsigned_long> *ppVar8;
  long lVar9;
  size_type __n_00;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  undefined1 (*pauVar13) [16];
  bool bVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  reference rVar15;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> tmp;
  vector<bool,_std::allocator<bool>_> visited;
  allocator_type local_c1;
  size_type local_c0;
  ulong local_b8;
  complex<double> *local_b0;
  pair<unsigned_long,_unsigned_long> *local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  complex<double> *local_90;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_88;
  long local_68;
  ulong local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  if (size != 1) {
    uVar11 = factors->first;
    puVar1 = &factors->second;
    *puVar1 = *puVar1 - 1;
    local_b0 = (complex<double> *)CONCAT71(local_b0._1_7_,*puVar1 == 0);
    local_b8 = size / uVar11;
    local_88._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_88._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_a8 = factors;
    local_a0 = baseStride;
    local_90 = base;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_58,size,(bool *)&local_88,&local_c1);
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_58,0);
    *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
    local_c0 = size;
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)&local_58,size - 1);
    local_98 = factorCount - ((ulong)local_b0 & 0xff);
    *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
    local_a8 = local_a8 + ((ulong)local_b0 & 0xff);
    for (__n = 0; ppVar8 = local_a8, __n != local_c0; __n = __n + 1) {
      local_b0 = beg + __n * stride;
      while( true ) {
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
        if ((*rVar15._M_p & rVar15._M_mask) != 0) break;
        local_88._M_impl.super__Vector_impl_data._M_start = *(pointer *)local_b0->_M_value;
        local_88._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_b0->_M_value + 8);
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
        sVar5 = __n;
        while( true ) {
          *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
          __n_00 = (sVar5 % local_b8) * uVar11 + sVar5 / local_b8;
          if (__n_00 == __n) break;
          uVar4 = *(undefined8 *)(beg[__n_00 * stride]._M_value + 8);
          *(undefined8 *)beg[sVar5 * stride]._M_value = *(undefined8 *)beg[__n_00 * stride]._M_value
          ;
          *(undefined8 *)(beg[sVar5 * stride]._M_value + 8) = uVar4;
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&local_58,__n_00);
          sVar5 = __n_00;
        }
        *(pointer *)beg[sVar5 * stride]._M_value = local_88._M_impl.super__Vector_impl_data._M_start
        ;
        *(pointer *)(beg[sVar5 * stride]._M_value + 8) =
             local_88._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    baseStride_00 = local_a0 * uVar11;
    local_c0 = local_b8 * stride;
    lVar7 = 0;
    local_a0 = uVar11;
    while (uVar12 = local_a0, bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
      cooleyTukey<std::complex<double>>
                (beg + local_c0 * lVar7,stride,local_90,baseStride_00,local_b8,ppVar8,local_98);
      lVar7 = lVar7 + 1;
    }
    local_b0 = (complex<double> *)(baseStride_00 / local_a0);
    ppVar8[(ulong)(ppVar8->first == local_a0) - 1].second =
         ppVar8[(ulong)(ppVar8->first == local_a0) - 1].second + 1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_88,
               local_a0,(allocator_type *)&local_c1);
    uVar10 = local_b8 * uVar12;
    local_68 = uVar12 * local_c0 * -0x10;
    ppVar8 = (pair<unsigned_long,_unsigned_long> *)(stride << 4);
    local_c0 = local_c0 << 4;
    uVar11 = 0;
    local_a8 = ppVar8;
    while (uVar11 < local_b8) {
      lVar7 = 0;
      uVar6 = uVar12;
      while (bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14) {
        uVar4 = *(undefined8 *)(beg->_M_value + 8);
        *(undefined8 *)((local_88._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar7) =
             *(undefined8 *)beg->_M_value;
        *(undefined8 *)
         ((long)((local_88._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar7) + 8) = uVar4
        ;
        beg = (complex<double> *)(beg->_M_value + local_c0);
        lVar7 = lVar7 + 0x10;
      }
      pauVar13 = (undefined1 (*) [16])(beg->_M_value + local_68);
      uVar6 = 0;
      local_60 = uVar11;
      while (uVar6 != uVar12) {
        *(undefined8 *)*pauVar13 = 0;
        *(undefined8 *)(*pauVar13 + 8) = 0;
        lVar9 = 0;
        lVar7 = 0;
        local_98 = uVar6;
        while (bVar14 = uVar12 != 0, uVar12 = uVar12 - 1, bVar14) {
          std::operator*((complex<double> *)
                         ((local_88._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9),
                         local_90 + ((lVar7 * uVar11) % uVar10) * (long)local_b0);
          dVar3 = in_XMM1_Qa + *(double *)(*pauVar13 + 8);
          auVar2._8_4_ = SUB84(dVar3,0);
          auVar2._0_8_ = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) + *(double *)*pauVar13;
          auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
          *pauVar13 = auVar2;
          lVar7 = lVar7 + 1;
          lVar9 = lVar9 + 0x10;
        }
        pauVar13 = (undefined1 (*) [16])(*pauVar13 + local_c0);
        uVar11 = uVar11 + local_b8;
        ppVar8 = local_a8;
        uVar12 = local_a0;
        uVar6 = local_98 + 1;
      }
      beg = (complex<double> *)(*pauVar13 + (long)ppVar8 + local_68);
      uVar11 = local_60 + 1;
    }
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_88);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  }
  return;
}

Assistant:

constexpr void cooleyTukey(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size, std::pair<uint64_t, uint64_t>* factors, uint64_t factorCount)
		{
			if (size == 1)
			{
				return;
			}

			// TODO: https://en.wikipedia.org/wiki/Rader%27s_FFT_algorithm
			// if (factorCount == 1 && factors->second == 1)
			// {
			// }

			// Compute best radix and remove it from factors

			const uint64_t radix = factors->first;

			--factors->second;
			if (factors->second == 0)
			{
				++factors;
				--factorCount;
			}

			// Re-order elements according to radix

			const uint64_t subSize = size / radix;

			std::vector<bool> visited(size, false);
			visited[0] = true;
			visited[size - 1] = true;

			uint64_t n = 0;
			uint64_t preced, next;
			while (n != size)
			{
				if (visited[n])
				{
					++n;
					continue;
				}

				TValue tmp = *(beg + n * stride);
				visited[n] = true;

				preced = n;
				next = preced / subSize + (preced % subSize) * radix;

				while (next != n)
				{
					*(beg + preced * stride) = *(beg + next * stride);
					visited[next] = true;

					preced = next;
					next = preced / subSize + (preced % subSize) * radix;
				}

				*(beg + preced * stride) = tmp;
			}

			// Run algorithm on sub-ranges

			size = subSize;
			baseStride *= radix;

			for (uint64_t i = 0; i < radix; ++i)
			{
				cooleyTukey(beg + i * size * stride, stride, base, baseStride, size, factors, factorCount);
			}

			baseStride /= radix;
			const uint64_t realSize = size * radix;

			// Put back the factor

			if (factors->first != radix)
			{
				--factors;
				++factorCount;
			}
			++factors->second;

			// Merge sub-ranges

			const uint64_t rangeOffset = size * stride;
				
			std::vector<TValue> tmp(radix);
			TValue* it = beg;
			for (uint64_t i = 0; i < size; ++i, it += stride)
			{
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset)
				{
					tmp[j] = *it;
				}
				it -= radix * rangeOffset;

				uint64_t coeff = i;
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset, coeff += size)
				{
					*it = 0;
					for (uint64_t k = 0; k < radix; ++k)
					{
						*it += tmp[k] * *(base + ((k * coeff) % realSize) * baseStride);
					}
				}
				it -= radix * rangeOffset;
			}
		}